

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O1

void __thiscall QOpenGLTexture::setLevelofDetailBias(QOpenGLTexture *this,float bias)

{
  QOpenGLTexturePrivate *this_00;
  QOpenGLTextureHelper *pQVar1;
  char cVar2;
  code *UNRECOVERED_JUMPTABLE;
  long *plVar3;
  
  QOpenGLContext::currentContext();
  cVar2 = QOpenGLContext::isOpenGLES();
  if (cVar2 == '\0') {
    this_00 = (this->d_ptr).d;
    QOpenGLTexturePrivate::create(this_00);
    this_00->levelOfDetailBias = bias;
    pQVar1 = this_00->texFuncs;
    UNRECOVERED_JUMPTABLE = (code *)pQVar1->TextureParameterf;
    plVar3 = (long *)((long)&pQVar1->functions + *(long *)&pQVar1->field_0x30);
    if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
      UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar3 + -1);
    }
    (*UNRECOVERED_JUMPTABLE)
              (plVar3,this_00->textureId,this_00->target,this_00->bindingTarget,0x8501);
    return;
  }
  setLevelofDetailBias();
  return;
}

Assistant:

void QOpenGLTexture::setLevelofDetailBias(float bias)
{
#if !QT_CONFIG(opengles2)
    if (!QOpenGLContext::currentContext()->isOpenGLES()) {
        Q_D(QOpenGLTexture);
        d->create();
        Q_ASSERT(d->texFuncs);
        Q_ASSERT(d->textureId);
        d->levelOfDetailBias = bias;
        d->texFuncs->glTextureParameterf(d->textureId, d->target, d->bindingTarget, GL_TEXTURE_LOD_BIAS, bias);
        return;
    }
#else
    Q_UNUSED(bias);
#endif
    qWarning("QOpenGLTexture: Detail level is not supported");
}